

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_x.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_X>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps,double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
               double *vsigma_bb)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  undefined8 *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double in_XMM1_Qa;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double in_XMM2_Qa;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  double t181;
  double t178;
  double t176;
  double t173;
  double t168;
  double t164;
  double t162;
  double t160;
  double t159;
  double t158;
  double t156;
  double t155;
  double t154;
  double t150;
  double t149;
  double t146;
  double t144;
  double t139;
  double t138;
  double t135;
  double t131;
  double t129;
  double t126;
  double t122;
  double t121;
  double t118;
  double t116;
  double t115;
  double t111;
  double t109;
  double t107;
  double t106;
  double t105;
  double t103;
  double t102;
  double t101;
  double t99;
  double t96;
  double t95;
  double t94;
  double t90;
  double t89;
  double t86;
  double t84;
  double t83;
  double t82;
  double t81;
  double t77;
  double t72;
  double t68;
  double t66;
  double t65;
  double t64;
  double t63;
  double t62;
  double t61;
  double t59;
  double t58;
  double t57;
  double t56;
  double t54;
  double t53;
  double t52;
  double t48;
  double t43;
  double t39;
  double t37;
  double t36;
  double t35;
  double t34;
  double t27;
  double t26;
  double t25;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t16;
  double t15;
  double t14;
  double t11;
  double t10;
  double t7;
  double t6;
  double t1;
  double t171;
  double t100;
  double t33;
  double t32;
  double t29;
  double t5;
  double t31;
  double t28;
  double t3;
  double t2;
  
  dVar28 = (double)(-(ulong)(in_XMM0_Qa <= 1e-32) & 0x3ff0000000000000);
  dVar29 = in_XMM0_Qa + in_XMM1_Qa;
  dVar1 = 1.0 / dVar29;
  dVar2 = (double)(-(ulong)((in_XMM0_Qa + in_XMM0_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar3 = (double)(-(ulong)((in_XMM1_Qa + in_XMM1_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar4 = in_XMM0_Qa - in_XMM1_Qa;
  dVar5 = piecewise_functor_5<double>
                    ((bool)(-(dVar2 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar3 != 0.0) & 1),
                     0.999999999999999,dVar4 * dVar1);
  dVar24 = (double)(-(ulong)(dVar5 + 1.0 <= 1e-15) & 0x3ff0000000000000);
  dVar6 = safe_math::cbrt<double>(9.20136989370529e-318);
  dVar7 = safe_math::cbrt<double>(9.20162186718467e-318);
  dVar5 = piecewise_functor_3<double>
                    ((bool)(-(dVar24 != 0.0) & 1),dVar6 * 1e-15,dVar7 * (dVar5 + 1.0));
  dVar8 = safe_math::cbrt<double>(9.20212087348697e-318);
  dVar9 = safe_math::cbrt<double>(9.20264458307156e-318);
  dVar25 = (1.0 / (dVar9 * dVar9)) / (in_XMM0_Qa * in_XMM0_Qa);
  dVar26 = (in_XMM2_Qa * 0.21733691746289932 * 0.3988851774453903 * dVar25) / 24.0 + 0.804;
  dVar27 = (1.0 - 0.804 / dVar26) * 0.804 + 1.0;
  dVar10 = piecewise_functor_3<double>
                     ((bool)(-(dVar28 != 0.0) & 1),0.0,dVar5 * dVar8 * -0.36927938319101117 * dVar27
                     );
  dVar30 = (double)(-(ulong)(in_XMM1_Qa <= 1e-32) & 0x3ff0000000000000);
  dVar11 = piecewise_functor_5<double>
                     ((bool)(-(dVar3 != 0.0) & 1),-0.999999999999999,(bool)(-(dVar2 != 0.0) & 1),
                      0.999999999999999,-dVar4 * dVar1);
  dVar12 = (double)(-(ulong)(dVar11 + 1.0 <= 1e-15) & 0x3ff0000000000000);
  dVar13 = safe_math::cbrt<double>(9.20521372442994e-318);
  dVar6 = piecewise_functor_3<double>(dVar12 != 0.0,dVar6 * 1e-15,dVar13 * (dVar11 + 1.0));
  dVar11 = (double)CONCAT44(in_XMM4_Db,in_XMM4_Da) * 0.21733691746289932;
  dVar14 = safe_math::cbrt<double>(9.2060733986537e-318);
  dVar15 = (1.0 / (dVar14 * dVar14)) / (in_XMM1_Qa * in_XMM1_Qa);
  dVar16 = (dVar11 * 0.3988851774453903 * dVar15) / 24.0 + 0.804;
  dVar17 = (1.0 - 0.804 / dVar16) * 0.804 + 1.0;
  dVar18 = piecewise_functor_3<double>
                     (dVar30 != 0.0,0.0,dVar6 * dVar8 * -0.36927938319101117 * dVar17);
  dVar19 = 1.0 / (dVar29 * dVar29);
  dVar20 = dVar4 * dVar19;
  dVar21 = piecewise_functor_5<double>(dVar2 != 0.0,0.0,dVar3 != 0.0,0.0,dVar1 - dVar20);
  dVar21 = piecewise_functor_3<double>(dVar24 != 0.0,0.0,dVar7 * 1.3333333333333333 * dVar21);
  dVar22 = 1.0 / (dVar8 * dVar8);
  dVar23 = (dVar5 * dVar22 * 0.9847450218426964 * dVar27) / 8.0;
  dVar5 = dVar5 * dVar8 * 0.6464160000000001 * 0.9847450218426964;
  dVar26 = (1.0 / (dVar26 * dVar26)) * 0.2195149727645171;
  dVar9 = piecewise_functor_3<double>
                    (dVar28 != 0.0,0.0,
                     dVar21 * dVar8 * -0.36927938319101117 * dVar27 + -dVar23 +
                     (dVar5 * dVar26 * 1.8171205928321397 * in_XMM2_Qa * 0.21733691746289932 *
                              ((1.0 / (dVar9 * dVar9)) / (in_XMM0_Qa * in_XMM0_Qa * in_XMM0_Qa))) /
                     24.0);
  dVar19 = -dVar4 * dVar19;
  dVar4 = piecewise_functor_5<double>(dVar3 != 0.0,0.0,dVar2 != 0.0,0.0,-dVar1 - dVar19);
  dVar4 = piecewise_functor_3<double>(dVar12 != 0.0,0.0,dVar13 * 1.3333333333333333 * dVar4);
  dVar21 = (dVar6 * dVar22 * 0.9847450218426964 * dVar17) / 8.0;
  dVar4 = piecewise_functor_3<double>
                    (dVar30 != 0.0,0.0,dVar4 * dVar8 * -0.36927938319101117 * dVar17 + -dVar21);
  dVar20 = piecewise_functor_5<double>(dVar2 != 0.0,0.0,dVar3 != 0.0,0.0,-dVar1 - dVar20);
  dVar7 = piecewise_functor_3<double>(dVar24 != 0.0,0.0,dVar7 * 1.3333333333333333 * dVar20);
  dVar7 = piecewise_functor_3<double>
                    (dVar28 != 0.0,0.0,dVar7 * dVar8 * -0.36927938319101117 * dVar27 + -dVar23);
  dVar1 = piecewise_functor_5<double>(dVar3 != 0.0,0.0,dVar2 != 0.0,0.0,dVar1 - dVar19);
  dVar1 = piecewise_functor_3<double>(dVar12 != 0.0,0.0,dVar13 * 1.3333333333333333 * dVar1);
  dVar2 = dVar6 * dVar8 * 0.6464160000000001 * 0.9847450218426964;
  dVar3 = (1.0 / (dVar16 * dVar16)) * 0.2195149727645171;
  dVar1 = piecewise_functor_3<double>
                    (dVar30 != 0.0,0.0,
                     dVar1 * dVar8 * -0.36927938319101117 * dVar17 + -dVar21 +
                     (dVar2 * dVar3 * 1.8171205928321397 * dVar11 *
                              ((1.0 / (dVar14 * dVar14)) / (in_XMM1_Qa * in_XMM1_Qa * in_XMM1_Qa)))
                     / 24.0);
  dVar5 = piecewise_functor_3<double>
                    (dVar28 != 0.0,0.0,(-dVar5 * dVar26 * 0.3949273883044934 * dVar25) / 64.0);
  dVar2 = piecewise_functor_3<double>
                    (dVar30 != 0.0,0.0,(-dVar2 * dVar3 * 0.3949273883044934 * dVar15) / 64.0);
  *in_RDI = dVar10 + dVar18;
  *in_RSI = dVar29 * (dVar9 + dVar4) + dVar10 + dVar18;
  *in_RDX = dVar29 * (dVar7 + dVar1) + dVar10 + dVar18;
  *in_RCX = dVar29 * dVar5;
  *in_R8 = 0;
  *in_R9 = dVar29 * dVar2;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb ) {

    (void)(sigma_ab);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t28 = constants::m_cbrt_6;
    constexpr double t31 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 / t3;
    constexpr double t29 = mu * t28;
    constexpr double t32 = t31 * t31;
    constexpr double t33 = 0.1e1 / t32;
    constexpr double t100 = kappa * kappa;
    constexpr double t171 = t28 * t33;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t10 = 0.2e1 * rho_a * t7 <= zeta_tol;
    const double t11 = zeta_tol - 0.1e1;
    const double t14 = 0.2e1 * rho_b * t7 <= zeta_tol;
    const double t15 = -t11;
    const double t16 = rho_a - rho_b;
    const double t18 = piecewise_functor_5( t10, t11, t14, t15, t16 * t7 );
    const double t19 = 0.1e1 + t18;
    const double t20 = t19 <= zeta_tol;
    const double t21 = safe_math::cbrt( zeta_tol );
    const double t22 = t21 * zeta_tol;
    const double t23 = safe_math::cbrt( t19 );
    const double t25 = piecewise_functor_3( t20, t22, t23 * t19 );
    const double t26 = safe_math::cbrt( t6 );
    const double t27 = t25 * t26;
    const double t34 = t33 * sigma_aa;
    const double t35 = rho_a * rho_a;
    const double t36 = safe_math::cbrt( rho_a );
    const double t37 = t36 * t36;
    const double t39 = 0.1e1 / t37 / t35;
    const double t43 = kappa + t29 * t34 * t39 / 0.24e2;
    const double t48 = 0.1e1 + kappa * ( 0.1e1 - kappa / t43 );
    const double t52 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t27 * t48 );
    const double t53 = rho_b <= dens_tol;
    const double t54 = -t16;
    const double t56 = piecewise_functor_5( t14, t11, t10, t15, t54 * t7 );
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( t57 );
    const double t61 = piecewise_functor_3( t58, t22, t59 * t57 );
    const double t62 = t61 * t26;
    const double t63 = t33 * sigma_bb;
    const double t64 = rho_b * rho_b;
    const double t65 = safe_math::cbrt( rho_b );
    const double t66 = t65 * t65;
    const double t68 = 0.1e1 / t66 / t64;
    const double t72 = kappa + t29 * t63 * t68 / 0.24e2;
    const double t77 = 0.1e1 + kappa * ( 0.1e1 - kappa / t72 );
    const double t81 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t62 * t77 );
    const double t82 = t6 * t6;
    const double t83 = 0.1e1 / t82;
    const double t84 = t16 * t83;
    const double t86 = piecewise_functor_5( t10, 0.0, t14, 0.0, t7 - t84 );
    const double t89 = piecewise_functor_3( t20, 0.0, 0.4e1 / 0.3e1 * t23 * t86 );
    const double t90 = t89 * t26;
    const double t94 = t26 * t26;
    const double t95 = 0.1e1 / t94;
    const double t96 = t25 * t95;
    const double t99 = t5 * t96 * t48 / 0.8e1;
    const double t101 = t27 * t100;
    const double t102 = t5 * t101;
    const double t103 = t43 * t43;
    const double t105 = 0.1e1 / t103 * mu;
    const double t106 = t105 * t28;
    const double t107 = t35 * rho_a;
    const double t109 = 0.1e1 / t37 / t107;
    const double t111 = t106 * t34 * t109;
    const double t115 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t90 * t48 - t99 + t102 * t111 / 0.24e2 );
    const double t116 = t54 * t83;
    const double t118 = piecewise_functor_5( t14, 0.0, t10, 0.0, -t7 - t116 );
    const double t121 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t59 * t118 );
    const double t122 = t121 * t26;
    const double t126 = t61 * t95;
    const double t129 = t5 * t126 * t77 / 0.8e1;
    const double t131 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t122 * t77 - t129 );
    const double t135 = piecewise_functor_5( t10, 0.0, t14, 0.0, -t7 - t84 );
    const double t138 = piecewise_functor_3( t20, 0.0, 0.4e1 / 0.3e1 * t23 * t135 );
    const double t139 = t138 * t26;
    const double t144 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t139 * t48 - t99 );
    const double t146 = piecewise_functor_5( t14, 0.0, t10, 0.0, t7 - t116 );
    const double t149 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t59 * t146 );
    const double t150 = t149 * t26;
    const double t154 = t62 * t100;
    const double t155 = t5 * t154;
    const double t156 = t72 * t72;
    const double t158 = 0.1e1 / t156 * mu;
    const double t159 = t158 * t28;
    const double t160 = t64 * rho_b;
    const double t162 = 0.1e1 / t66 / t160;
    const double t164 = t159 * t63 * t162;
    const double t168 = piecewise_functor_3( t53, 0.0, -0.3e1 / 0.8e1 * t5 * t150 * t77 - t129 + t155 * t164 / 0.24e2 );
    const double t173 = t105 * t171 * t39;
    const double t176 = piecewise_functor_3( t1, 0.0, -t102 * t173 / 0.64e2 );
    const double t178 = t158 * t171 * t68;
    const double t181 = piecewise_functor_3( t53, 0.0, -t155 * t178 / 0.64e2 );


    eps = t52 + t81;
    vrho_a = t52 + t81 + t6 * ( t115 + t131 );
    vrho_b = t52 + t81 + t6 * ( t144 + t168 );
    vsigma_aa = t6 * t176;
    vsigma_ab = 0.e0;
    vsigma_bb = t6 * t181;

  }